

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledInputFile::DeepTiledInputFile
          (DeepTiledInputFile *this,Header *header,IStream *is,int version,int numThreads)

{
  int iVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  undefined4 in_ECX;
  IStream *in_RDX;
  TileOffsets *in_RSI;
  GenericInputFile *in_RDI;
  undefined4 in_R8D;
  Header *in_stack_00000008;
  Header *in_stack_00000010;
  int in_stack_0000001c;
  Data *in_stack_00000020;
  DeepTiledInputFile *in_stack_000003a0;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__DeepTiledInputFile_0374bd38;
  pp_Var2 = (_func_int **)operator_new(0x1e8);
  Data::Data(in_stack_00000020,in_stack_0000001c);
  in_RDI[1]._vptr_GenericInputFile = pp_Var2;
  *(IStream **)(in_RDI[1]._vptr_GenericInputFile[0x3b] + 0x28) = in_RDX;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x3c) = 0;
  Header::operator=(in_stack_00000010,in_stack_00000008);
  *(undefined4 *)(in_RDI[1]._vptr_GenericInputFile + 0xe) = in_ECX;
  initialize(in_stack_000003a0);
  TileOffsets::readFrom
            (in_RSI,in_RDX,(bool *)CONCAT44(in_ECX,in_R8D),(bool)in_stack_ffffffffffffffdf,
             (bool)in_stack_ffffffffffffffde);
  iVar1 = (*in_RDX->_vptr_IStream[2])();
  *(byte *)(in_RDI[1]._vptr_GenericInputFile + 0x31) = (byte)iVar1 & 1;
  uVar3 = (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x3b] + 0x28) + 0x28))();
  *(undefined8 *)(in_RDI[1]._vptr_GenericInputFile[0x3b] + 0x30) = uVar3;
  return;
}

Assistant:

DeepTiledInputFile::DeepTiledInputFile (const Header &header,
                                        OPENEXR_IMF_INTERNAL_NAMESPACE::IStream *is,
                                        int version,
                                        int numThreads) :
    _data (new Data (numThreads))
    
{
    _data->_streamData->is = is;
    _data->_deleteStream=false;
    
    //
    // This constructor called by class Imf::InputFile
    // when a user wants to just read an image file, and
    // doesn't care or know if the file is tiled.
    // No need to have backward compatibility here, because
    // we have the header.
    //

    _data->header = header;
    _data->version = version;
    initialize();
    _data->tileOffsets.readFrom (*(_data->_streamData->is), _data->fileIsComplete,false,true);
    _data->memoryMapped = is->isMemoryMapped();
    _data->_streamData->currentPosition = _data->_streamData->is->tellg();
}